

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O3

void __thiscall
ArgParser::add(ArgParser *this,uint *var,string *name,string *shortName,string *description,
              uint *validArgs,int nrValid,bool optional)

{
  pointer pcVar1;
  pointer pAVar2;
  pointer pAVar3;
  void *pvVar4;
  pointer puVar5;
  int iVar6;
  allocator_type local_a9;
  string local_a8;
  string local_88;
  string local_68;
  void *local_48;
  pointer puStack_40;
  pointer local_38;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (shortName->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + shortName->_M_string_length);
  pcVar1 = (description->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + description->_M_string_length);
  add(this,var,&local_a8,&local_68,&local_88,optional);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar3 = (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,validArgs,
             validArgs + nrValid,&local_a9);
  iVar6 = (int)((ulong)((long)pAVar2 - (long)pAVar3) >> 5) * -0x49249249 + -1;
  pAVar2 = (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = *(void **)&pAVar2[iVar6].validUINT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
  puVar5 = *(pointer *)
            ((long)&pAVar2[iVar6].validUINT.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 0x10);
  *(void **)&pAVar2[iVar6].validUINT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
       = local_48;
  *(pointer *)
   ((long)&pAVar2[iVar6].validUINT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> +
   8) = puStack_40;
  *(pointer *)
   ((long)&pAVar2[iVar6].validUINT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> +
   0x10) = local_38;
  local_48 = (void *)0x0;
  puStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)puVar5 - (long)pvVar4);
    if (local_48 != (void *)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
  }
  (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
  super__Vector_impl_data._M_start[iVar6].checkValid = true;
  return;
}

Assistant:

void ArgParser::add(unsigned int *var,
                    std::string name, std::string shortName, std::string description,
                    unsigned int validArgs[], int nrValid,
                    bool optional)
{
    add(var, name, shortName, description, optional);
    int ind = m_args.size() - 1;
    m_args[ind].validUINT = std::vector<unsigned int>(validArgs, validArgs+nrValid);
    m_args[ind].checkValid = true;
}